

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Parser::ErrorWriteDetails(Parser *this)

{
  pointer pSVar1;
  pointer pSVar2;
  Symbol *pSVar3;
  size_type sVar4;
  ulong uVar5;
  long lVar7;
  ulong uVar8;
  pointer pSVar9;
  char *__s;
  ulong uVar10;
  SymbolListCItr curr;
  pointer pSVar11;
  SymbolListCItr symbol;
  bool bVar12;
  ulong uVar13;
  String markerText;
  String symbolText;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_88;
  String local_68;
  pointer local_48;
  Parser *local_40;
  ulong local_38;
  size_type sVar6;
  
  pSVar11 = (this->m_currentSymbol)._M_current;
  pSVar2 = (this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar9 = pSVar11 + -1;
  if (pSVar2 != pSVar11) {
    pSVar9 = pSVar11;
  }
  pSVar11 = pSVar9 + -1;
  if (pSVar9->type != NewLine) {
    pSVar11 = pSVar9;
  }
  lVar7 = 0x38;
  if (pSVar11->type != NewLine) {
    pSVar9 = pSVar11;
    do {
      if (pSVar9 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_start) {
        lVar7 = 0;
        pSVar11 = pSVar9;
        break;
      }
      pSVar11 = pSVar9 + -1;
      pSVar1 = pSVar9 + -1;
      pSVar9 = pSVar11;
    } while (pSVar1->type != NewLine);
  }
  symbol._M_current = (Symbol *)((long)&pSVar11->type + lVar7);
  for (pSVar11 = symbol._M_current; (pSVar11 != pSVar2 && (pSVar11->type != NewLine));
      pSVar11 = pSVar11 + 1) {
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_40 = this;
  if (symbol._M_current == pSVar11) {
    uVar5 = 0;
    uVar10 = 0;
    uVar8 = 0;
  }
  else {
    bVar12 = false;
    uVar8 = 0;
    uVar10 = 0;
    uVar5 = 0;
    local_48 = pSVar11;
    do {
      local_38 = uVar8;
      WriteSymbol(symbol,&local_68);
      sVar4 = local_68._M_string_length;
      pSVar3 = (local_40->m_currentSymbol)._M_current;
      LogWrite(Error,local_68._M_dataplus._M_p);
      if (symbol._M_current == pSVar3) {
        bVar12 = true;
      }
      sVar6 = sVar4;
      uVar8 = uVar5;
      if (bVar12) {
        sVar6 = 0;
        uVar8 = uVar10;
      }
      uVar10 = uVar8;
      uVar5 = sVar6 + uVar5;
      uVar8 = local_38 + sVar4;
      symbol._M_current = symbol._M_current + 1;
    } while (symbol._M_current != local_48);
  }
  uVar13 = 0;
  if (uVar8 != 0) {
    uVar13 = uVar8 - 1;
  }
  if (uVar5 < uVar13) {
    uVar10 = uVar5;
  }
  LogWrite(Error,"\n");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (&local_88,0x20);
  if (1 < uVar8) {
    uVar5 = 0;
    do {
      __s = "^";
      if (uVar5 < uVar10) {
        __s = " ";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                (&local_88,__s);
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar13);
  }
  LogWriteLine(Error,local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    MemFree(local_88._M_dataplus._M_p,
            CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0])
            + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    MemFree(local_68._M_dataplus._M_p,
            CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
            + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ErrorWriteDetails() const
	{
		// Write line of code containing error

		// Find starting symbol of error line.  Harder than you might think
		auto start = m_currentSymbol;
		if (start == m_symbolList.end())
			--start;
		if (start->type == SymbolType::NewLine)
			--start;
		while (start->type != SymbolType::NewLine && start != m_symbolList.begin())
			--start;
		if (start->type == SymbolType::NewLine)
			++start;

		// Once we find the supposed start, find the end from that location
		auto end = start;
		while (end != m_symbolList.end() && end->type != SymbolType::NewLine)
			++end;

		// Print out the symbols and find error start index
		bool foundError = false;
		size_t errorIndex = 0;
		size_t lastErrorIndex = 0;
		size_t endIndex = 0;
		String symbolText;
		for (auto curr = start; curr != end; ++curr)
		{
			WriteSymbol(curr, symbolText);
			if (curr == m_currentSymbol)
				foundError = true;
			if (!foundError)
			{
				lastErrorIndex = errorIndex;
				errorIndex += symbolText.size();
			}
			endIndex += symbolText.size();
			LogWrite(LogLevel::Error, symbolText.c_str());
		}
		if (endIndex)
			--endIndex;
		if (errorIndex >= endIndex)
			errorIndex = lastErrorIndex;
		LogWrite(LogLevel::Error, "\n");

		// Write marker showing location of error
		String markerText;
		markerText.reserve(32);
		for (size_t i = 0; i < endIndex; ++i)
			markerText += (i < errorIndex) ? " " : "^";
		LogWriteLine(LogLevel::Error, markerText.c_str());
	}